

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::BringWindowToDisplayBack(ImGuiWindow *window)

{
  ImGuiWindow **__src;
  ImGuiContext *pIVar1;
  long lVar2;
  size_t __n;
  
  pIVar1 = GImGui;
  __src = (GImGui->Windows).Data;
  if ((*__src != window) && (lVar2 = (long)(GImGui->Windows).Size, 0 < lVar2)) {
    __n = 0;
    do {
      if (*(ImGuiWindow **)((long)__src + __n) == window) {
        memmove(__src + 1,__src,__n);
        *(pIVar1->Windows).Data = window;
        return;
      }
      __n = __n + 8;
    } while (lVar2 * 8 != __n);
  }
  return;
}

Assistant:

void ImGui::BringWindowToDisplayBack(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    if (g.Windows[0] == window)
        return;
    for (int i = 0; i < g.Windows.Size; i++)
        if (g.Windows[i] == window)
        {
            memmove(&g.Windows[1], &g.Windows[0], (size_t)i * sizeof(ImGuiWindow*));
            g.Windows[0] = window;
            break;
        }
}